

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O2

void gen_trie(fb_output_t *out,trie_t *trie,int a,int b,int pos)

{
  bool bVar1;
  trie_t *ptVar2;
  int iVar3;
  int *piVar4;
  uint label;
  int iVar5;
  long lVar6;
  dict_entry_t *pdVar7;
  char *format;
  fb_output_t *out_00;
  undefined4 in_register_00000084;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int a_00;
  ulong uVar12;
  int len;
  char *name;
  int local_ac;
  trie_t *local_a8;
  uint64_t wf;
  int local_94;
  long local_90;
  dict_entry_t *local_88;
  ulong local_80;
  ulong local_78;
  undefined8 local_70;
  uint64_t wmf;
  uint64_t wg;
  fb_output_t *local_58;
  uint64_t tag;
  long local_48;
  long local_40;
  uint64_t local_38;
  
  local_70 = CONCAT44(in_register_00000084,pos);
  local_80 = (ulong)(uint)a;
  tag = 0;
  name = "";
  len = 0;
  local_88 = trie->dict;
  local_90 = (long)a;
  local_40 = local_90 * 0x20;
  local_94 = pos + 8;
  local_78 = (ulong)b;
  if ((local_88[local_90].len < local_94 || local_88[local_90].len - pos == 8) &&
     ((b == a ||
      ((a + 1 == b && (local_88[local_78].len < local_94 || local_88[local_78].len - pos == 8))))))
  {
    gen_prefix_trie(out,trie,a,b,pos,0);
    return;
  }
  wf = 0;
  wg = 0;
  wmf = 0;
  uVar12 = (ulong)((b - a) / 2 + a);
  lVar6 = uVar12 << 0x20;
  local_48 = uVar12 * 0x20;
  pdVar7 = local_88 + uVar12;
  local_ac = b;
  local_a8 = trie;
  local_58 = out;
  for (uVar9 = uVar12; local_90 < (long)uVar9; uVar9 = uVar9 - 1) {
    iVar3 = (int)local_70;
    get_dict_tag(pdVar7 + -1,iVar3,&wf,&wmf,(char **)0x0,(int *)0x0);
    get_dict_tag(pdVar7,iVar3,&wg,&local_38,(char **)0x0,(int *)0x0);
    if ((wmf & (wg ^ wf)) != 0) {
      iVar3 = (int)uVar9;
      if ((int)local_80 < iVar3) {
        iVar5 = (int)local_70;
        get_dict_tag((dict_entry_t *)((long)&local_88->text + (lVar6 >> 0x1b)),iVar5,&tag,&wf,&name,
                     &len);
        out_00 = local_58;
        println(local_58,"if (w < 0x%lx) { /* branch \"%.*s\" */",tag,(ulong)(uint)len,name);
        ptVar2 = local_a8;
        out_00->indent = out_00->indent + 1;
        gen_trie(out_00,local_a8,(int)local_80,iVar3 + -1,iVar5);
        if (out_00->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x402,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
        }
        out_00->indent = out_00->indent + -1;
        println(out_00,"} else { /* branch \"%.*s\" */",(ulong)(uint)len,name);
        out_00->indent = out_00->indent + 1;
        gen_trie(out_00,ptVar2,iVar3,local_ac,iVar5);
        if (out_00->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x404,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
        }
        out_00->indent = out_00->indent + -1;
        format = "} /* branch \"%.*s\" */";
        goto LAB_0011144d;
      }
      break;
    }
    lVar6 = lVar6 + -0x100000000;
    pdVar7 = pdVar7 + -1;
  }
  wf = 0;
  wg = 0;
  wmf = 0;
  pdVar7 = (dict_entry_t *)((long)&local_88->text + local_48);
  iVar3 = (int)local_70;
  do {
    if ((long)local_78 <= (long)uVar12) {
      uVar12 = (ulong)((int)uVar12 + 1);
      break;
    }
    get_dict_tag(pdVar7,iVar3,&wf,&wmf,(char **)0x0,(int *)0x0);
    uVar12 = uVar12 + 1;
    pdVar7 = pdVar7 + 1;
    get_dict_tag(pdVar7,iVar3,&wg,&local_38,(char **)0x0,(int *)0x0);
  } while ((wmf & (wg ^ wf)) == 0);
  lVar10 = (long)(int)uVar12;
  lVar6 = lVar10;
  if (lVar10 <= local_90) {
    lVar6 = local_90;
  }
  for (piVar4 = (int *)((long)&local_88->len + local_40);
      (lVar11 = lVar6, local_90 <= lVar10 + -1 &&
      ((*piVar4 < local_94 || (lVar11 = local_90, (*piVar4 - iVar3) + -8 < 1))));
      piVar4 = piVar4 + 8) {
    local_90 = local_90 + 1;
  }
  iVar5 = (int)lVar11;
  out_00 = local_58;
  local_90 = lVar11;
  if (iVar5 < (int)uVar12) {
    lVar6 = (lVar11 << 0x20) >> 0x1b;
    if ((int)local_80 < iVar5) {
      iVar5 = *(int *)((long)local_88 + lVar6 + -0x18);
      bVar8 = iVar5 - iVar3 == 8 && iVar5 <= local_94;
    }
    else {
      bVar8 = false;
    }
    local_78 = uVar12;
    get_dict_tag((dict_entry_t *)((long)&local_88->text + lVar6),iVar3,&tag,&wf,&name,&len);
    out_00 = local_58;
    println(local_58,"if (w == 0x%lx) { /* descend \"%.*s\" */",tag,(ulong)(uint)len,name);
    out_00->indent = out_00->indent + 1;
    iVar3 = (int)(lVar10 + -1);
    if (bVar8) {
      lVar6 = (lVar11 << 0x20) >> 0x20;
      println(out_00,"/* descend prefix key \"%.*s\" */",(ulong)(uint)len,name);
      ptVar2 = local_a8;
      (*local_a8->gen_match)
                (out_00,local_a8->ct,local_a8->dict[lVar6 + -1].data,local_a8->dict[lVar6 + -1].hint
                 ,8);
      println(out_00,"/* descend suffix \"%.*s\" */",(ulong)(uint)len,name);
      println(out_00,"buf += 8;");
      println(out_00,"w = flatcc_json_parser_symbol_part(buf, end);");
      iVar5 = (int)local_90;
      gen_trie(out_00,ptVar2,iVar5,iVar3,local_94);
      if (out_00->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x445,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
      }
      out_00->indent = out_00->indent + -1;
      println(out_00,"} /* desend suffix \"%.*s\" */",(ulong)(uint)len,name);
      iVar5 = iVar5 + -1;
    }
    else {
      println(out_00,"buf += 8;");
      println(out_00,"w = flatcc_json_parser_symbol_part(buf, end);");
      iVar5 = (int)local_90;
      gen_trie(out_00,local_a8,iVar5,iVar3,local_94);
    }
    uVar12 = local_78;
    iVar3 = (int)local_70;
    if (out_00->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x449,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
    }
    out_00->indent = out_00->indent + -1;
    println(out_00,"} else { /* descend \"%.*s\" */",(ulong)(uint)len,name);
    out_00->indent = out_00->indent + 1;
  }
  bVar1 = (int)local_80 < iVar5;
  a_00 = (int)uVar12;
  bVar8 = a_00 <= local_ac;
  label = 0;
  if (bVar8 && bVar1) {
    label = local_a8->label + 1;
    local_a8->label = label;
  }
  if ((int)local_80 < iVar5) {
    gen_prefix_trie(out_00,local_a8,(int)local_80,iVar5 + -1,iVar3,label);
    if (bVar8 && bVar1) {
      println(out_00,"goto endpfguard%d;",(ulong)label);
      out_00->tmp_indent = out_00->indent;
      out_00->indent = 0;
      println(out_00,"pfguard%d:",(ulong)label);
      out_00->indent = out_00->tmp_indent;
    }
    if (local_ac < a_00) goto LAB_0011141d;
  }
  else if (local_ac < a_00) {
    (*local_a8->gen_unmatched)(out_00);
    goto LAB_0011141d;
  }
  gen_trie(out_00,local_a8,a_00,local_ac,iVar3);
  if (bVar8 && bVar1) {
    out_00->tmp_indent = out_00->indent;
    out_00->indent = 0;
    println(out_00,"endpfguard%d:",(ulong)label);
    out_00->indent = out_00->tmp_indent;
    println(out_00,"(void)0;");
  }
LAB_0011141d:
  if ((int)local_90 < a_00) {
    if (out_00->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x465,"void gen_trie(fb_output_t *, trie_t *, int, int, int)");
    }
    out_00->indent = out_00->indent + -1;
    format = "} /* descend \"%.*s\" */";
LAB_0011144d:
    println(out_00,format,(ulong)(uint)len,name);
  }
  return;
}

Assistant:

static void gen_trie(fb_output_t *out, trie_t *trie, int a, int b, int pos)
{
    int x, k;
    uint64_t tag = 0, mask = 0;
    const char *name = "";
    int len = 0, has_prefix_key = 0, prefix_guard = 0, has_descend;
    int label = 0;

    /*
     * Process a trie at the level given by pos. A single level covers
     * one tag.
     *
     * A tag is a range of 8 characters [pos..pos+7] that is read as a
     * single big endian word and tested as against a ternary trie
     * generated in code. In generated code the tag is stored in "w".
     *
     * Normally trailing data in a tag is not a problem
     * because the difference between two keys happen in the middle and
     * trailing data is not valid key material. When the difference is
     * at the end, we get a lot of special cases to handle.
     *
     * Regardless, when we believe we have a match, a final check is
     * made to ensure that the next character after the match is not a
     * valid key character - for quoted keys a valid termiantot is a
     * quote, for unquoted keys it can be one of several characters -
     * therefore quoted keys are faster to parse, even if they consume
     * more space. The trie does not care about these details, the
     * gen_match function handles this transparently for different
     * symbol types.
     */


    /*
    * If we have one or two keys that terminate in this tag, there is no
    * need to do a branch test before matching exactly.
    *
    * We observe that `gen_prefix_trie` actually handles this
    * case well, even though it was not designed for it.
    */
    if ((get_dict_suffix_len(&trie->dict[a], pos) == 0) &&
        (b == a || (b == a + 1 && get_dict_suffix_len(&trie->dict[b], pos) == 0))) {
        gen_prefix_trie(out, trie, a, b, pos, 0);
        return;
    }

    /*
     * Due trie nature, we have a left, middle, and right range where
     * the middle range all compare the same at the current trie level
     * when masked against shortest (and first) key in middle range.
     */
    x = split_dict_left(trie->dict, a, b, pos);

    if (x > a) {
        /*
         * This is normal early branch with a key `a < x < b` such that
         * any shared prefix ranges do not span x.
         */
        get_dict_tag(&trie->dict[x], pos, &tag, &mask, &name, &len);
        println(out, "if (w < 0x%"PRIx64") { /* branch \"%.*s\" */", tag, len, name); indent();
        gen_trie(out, trie, a, x - 1, pos);
        unindent(); println(out, "} else { /* branch \"%.*s\" */", len, name); indent();
        gen_trie(out, trie, x, b, pos);
        unindent(); println(out, "} /* branch \"%.*s\" */", len, name);
        return;
    }
    x = split_dict_right(trie->dict, a, b, pos);

    /*
     * [a .. x-1] is a non-empty sequence of prefixes,
     * for example { a123, a1234, a12345 }.
     * The keys might not terminate in the current tag. To find those
     * that do, we will evaluate k such that:
     * [a .. k-1] are prefixes that terminate in the current tag if any
     * such exists.
     * [x..b] are keys that are prefixes up to at least pos + 7 but
     * do not terminate in the current tag.
     * [k..x-1] are prefixes that do not termiante in the current tag.
     * Note that they might not be prefixes when considering more than the
     * current tag.
     * The range [a .. x-1] can ge generated with `gen_prefix_trie`.
     *
     * We generally have the form
     *
     * [a..b] =
     * (a)<prefixes>, (k-1)<descend-prefix>, (k)<descend>, (x)<reminder>
     *
     * Where <prefixes> are keys that terminate at the current tag.
     * <descend> are keys that have the prefixes as prefix but do not
     * terminate at the current tag.
     * <descend-prerfix> is a single key that terminates exactly
     * where the tag ends. If there are no descend keys it is part of
     * prefixes, otherwise it is tested as a special case.
     * <reminder> are any keys larger than the prefixes.
     *
     * The reminder keys cannot be tested before we are sure that no
     * prefix is matching at least no prefixes that is not a
     * descend-prefix. This is because less than comparisons are
     * affected by trailing data within the tag caused by prefixes
     * terminating early. Trailing data is not a problem if two keys are
     * longer than the point where they differ even if they terminate
     * within the current tag.
     *
     * Thus, if we have non-empty <descend> and non-empty <reminder>,
     * the reminder must guard against any matches in prefix but not
     * against any matches in <descend>. If <descend> is empty and
     * <prefixes> == <descend-prefix> a guard is also not needed.
     */

    /* Find first prefix that does not terminate at the current level, or x if absent */
    k = split_dict_descend(trie->dict, a, x - 1, pos);
    has_descend = k < x;

    /* If we have a descend, process that in isolation. */
    if (has_descend) {
        has_prefix_key = k > a && get_dict_tag_len(&trie->dict[k - 1], pos) == 8;
        get_dict_tag(&trie->dict[k], pos, &tag, &mask, &name, &len);
        println(out, "if (w == 0x%"PRIx64") { /* descend \"%.*s\" */", tag, len, name); indent();
        if (has_prefix_key) {
            /* We have a key that terminates at the descend prefix. */
            println(out, "/* descend prefix key \"%.*s\" */", len, name);
            trie->gen_match(out, trie->ct, trie->dict[k - 1].data, trie->dict[k - 1].hint, 8);
            println(out, "/* descend suffix \"%.*s\" */", len, name);
        }
        println(out, "buf += 8;");
        println(out, "w = flatcc_json_parser_symbol_part(buf, end);");
        gen_trie(out, trie, k, x - 1, pos + 8);
        if (has_prefix_key) {
            unindent(); println(out, "} /* desend suffix \"%.*s\" */", len, name);
            /* Here we move the <descend-prefix> key out of the <descend> range. */
            --k;
        }
        unindent(); println(out, "} else { /* descend \"%.*s\" */", len, name); indent();
    }
    prefix_guard = a < k && x <= b;
    if (prefix_guard) {
        label = ++trie->label;
    }
    if (a < k) {
        gen_prefix_trie(out, trie, a, k - 1, pos, label);
    }
    if (prefix_guard) {
        /* All prefixes tested, but none matched. */
        println(out, "goto endpfguard%d;", label);
        margin();
        println(out, "pfguard%d:", label);
        unmargin();
    }
    if (x <= b) {
        gen_trie(out, trie, x, b, pos);
    } else if (a >= k) {
        trie->gen_unmatched(out);
    }
    if (prefix_guard) {
        margin();
        println(out, "endpfguard%d:", label);
        unmargin();
        println(out, "(void)0;");
    }
    if (has_descend) {
        unindent(); println(out, "} /* descend \"%.*s\" */", len, name);
    }
}